

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O2

REF_STATUS ref_layer_align_prism(REF_GRID ref_grid,REF_DICT ref_dict_bcs)

{
  int iVar1;
  REF_ADJ pRVar2;
  REF_DBL *pRVar3;
  REF_GEOM ref_geom;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  REF_CELL pRVar6;
  int *piVar7;
  int iVar8;
  uint uVar9;
  REF_STATUS RVar10;
  REF_BOOL RVar11;
  REF_STATUS RVar12;
  uint uVar13;
  void *pvVar14;
  ulong uVar15;
  REF_ADJ_ITEM pRVar16;
  long lVar17;
  ulong uVar18;
  undefined8 uVar19;
  long lVar20;
  REF_DICT pRVar21;
  long lVar22;
  REF_CELL pRVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  REF_NODE pRVar27;
  REF_CAVITY ref_cavity_00;
  char *pcVar28;
  int iVar29;
  int iVar30;
  REF_INT RVar31;
  double dVar32;
  long lVar33;
  REF_INT RVar34;
  bool bVar35;
  bool bVar36;
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ulong uStackY_720;
  REF_INT new_node;
  void *local_6f8;
  REF_DICT local_6f0;
  REF_NODE local_6e8;
  undefined8 local_6e0;
  REF_GLOB global;
  REF_CELL local_6d0;
  void *local_6c8;
  int local_6bc;
  double local_6b8;
  double local_6b0;
  double local_6a8;
  REF_INT local_6a0;
  REF_INT bc_1;
  REF_CAVITY ref_cavity_1;
  undefined8 uStack_690;
  undefined8 local_688;
  long local_620;
  REF_DBL tri_normal [3];
  REF_INT nodes [27];
  REF_BOOL has_side;
  int iStack_514;
  undefined8 uStack_510;
  REF_CAVITY ref_cavity;
  int local_4a0;
  int local_49c;
  int local_498;
  REF_INT bc;
  int iStack_434;
  REF_INT local_430;
  int iStack_42c;
  double local_428;
  double local_420;
  double local_418;
  double local_410;
  
  pRVar27 = ref_grid->node;
  pRVar23 = ref_grid->cell[3];
  uVar9 = ref_node_synchronize_globals(pRVar27);
  if (uVar9 != 0) {
    uStackY_720 = (ulong)uVar9;
    pcVar28 = "sync glob";
    uVar19 = 0x472;
LAB_001f919f:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar19,
           "ref_layer_align_prism",uStackY_720,pcVar28);
    return (REF_STATUS)uStackY_720;
  }
  uVar9 = ref_export_by_extension(ref_grid,"ref_layer_prism_before.tec");
  if (uVar9 != 0) {
    uStackY_720 = (ulong)uVar9;
    pcVar28 = "dump surf";
    uVar19 = 0x475;
    goto LAB_001f919f;
  }
  lVar33 = (long)pRVar27->max;
  local_6d0 = pRVar23;
  if (lVar33 < 0) {
    RVar12 = 1;
    pcVar28 = "malloc active of REF_BOOL negative";
  }
  else {
    pvVar14 = malloc(lVar33 * 4);
    RVar12 = 2;
    if (pvVar14 != (void *)0x0) {
      for (lVar17 = 0; lVar33 != lVar17; lVar17 = lVar17 + 1) {
        *(undefined4 *)((long)pvVar14 + lVar17 * 4) = 0;
      }
      local_6c8 = pvVar14;
      local_6f8 = malloc(lVar33 * 4);
      pRVar23 = local_6d0;
      if (local_6f8 != (void *)0x0) {
        for (lVar17 = 0; lVar33 != lVar17; lVar17 = lVar17 + 1) {
          *(undefined4 *)((long)local_6f8 + lVar17 * 4) = 0xffffffff;
        }
        iVar29 = 0;
        RVar12 = 0;
        local_6f0 = ref_dict_bcs;
        while( true ) {
          if (pRVar23->max <= iVar29) break;
          RVar10 = ref_cell_nodes(pRVar23,iVar29,nodes);
          if (RVar10 == 0) {
            bc = -1;
            RVar10 = ref_dict_value(local_6f0,nodes[pRVar23->node_per],&bc);
            if ((RVar10 != 0) && (RVar10 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x47d,"ref_layer_align_prism");
              RVar12 = RVar10;
            }
            if (((RVar10 == 5) || (RVar10 == 0)) &&
               (RVar11 = ref_phys_wall_distance_bc(bc), RVar11 != 0)) {
              uVar15 = (ulong)(uint)pRVar23->node_per;
              if (pRVar23->node_per < 1) {
                uVar15 = 0;
              }
              for (uVar18 = 0; uVar15 != uVar18; uVar18 = uVar18 + 1) {
                *(undefined4 *)((long)local_6c8 + (long)nodes[uVar18] * 4) = 1;
              }
            }
            if ((RVar10 != 5) && (RVar10 != 0)) {
              return RVar12;
            }
          }
          iVar29 = iVar29 + 1;
        }
        pRVar27 = ref_grid->node;
        pRVar23 = ref_grid->cell[3];
        pvVar14 = local_6c8;
        local_6e8 = pRVar27;
        for (dVar32 = 0.0; (long)dVar32 < (long)pRVar27->max; dVar32 = (double)((long)dVar32 + 1)) {
          if (((-1 < pRVar27->global[(long)dVar32]) &&
              (pRVar27->ref_mpi->id == pRVar27->part[(long)dVar32])) &&
             (*(int *)((long)pvVar14 + (long)dVar32 * 4) != 0)) {
            ref_cavity_1 = (REF_CAVITY)0x0;
            uStack_690 = 0.0;
            local_688 = 0.0;
            pRVar2 = pRVar23->ref_adj;
            local_6b8 = dVar32;
            if (((long)pRVar2->nnode <= (long)dVar32) ||
               (iVar29 = pRVar2->first[(long)dVar32], iVar29 == -1)) {
              local_6e0 = (double)((ulong)local_6e0._4_4_ << 0x20);
              iVar29 = -1;
              iVar30 = -1;
              iVar25 = -1;
              goto LAB_001f9437;
            }
            pRVar16 = pRVar2->item;
            local_6e0 = (double)((ulong)local_6e0._4_4_ << 0x20);
            iVar30 = -1;
            ref_cavity_1 = (REF_CAVITY)0x0;
            uStack_690 = 0.0;
LAB_001f9561:
            iVar25 = pRVar16[iVar29].ref;
LAB_001f9437:
            while (iVar29 != -1) {
              iVar1 = pRVar23->c2n[(long)pRVar23->size_per * (long)iVar25 + (long)pRVar23->node_per]
              ;
              RVar12 = ref_dict_value(local_6f0,iVar1,&bc_1);
              if ((RVar12 != 0) && (RVar12 != 5)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x3f7,"ref_layer_prism_insert_hair");
                local_6a8 = (double)CONCAT44(local_6a8._4_4_,RVar12);
              }
              if ((RVar12 != 5) && (RVar12 != 0)) {
                uStackY_720 = (ulong)local_6a8 & 0xffffffff;
                if (local_6a8._0_4_ != 0) goto LAB_001f9e23;
                goto LAB_001f992f;
              }
              RVar11 = ref_phys_wall_distance_bc(bc_1);
              if (RVar11 == 0) {
                bVar35 = iVar30 != -1;
                bVar36 = iVar30 != iVar1;
                local_6e0 = (double)CONCAT44(local_6e0._4_4_,1);
                iVar30 = iVar1;
                if (bVar36 && bVar35) {
                  pcVar28 = "multiple face constraints";
                  uVar19 = 0x402;
                  goto LAB_001f9e19;
                }
              }
              else {
                uVar9 = ref_node_tri_normal(local_6e8,
                                            pRVar23->c2n + (long)pRVar23->size_per * (long)iVar25,
                                            tri_normal);
                if (uVar9 != 0) {
                  uStackY_720 = (ulong)uVar9;
                  pcVar28 = "tri norm";
                  uVar19 = 0x3fb;
                  goto LAB_001f990f;
                }
                ref_cavity_1 = (REF_CAVITY)
                               ((double)CONCAT44(tri_normal[0]._4_4_,tri_normal[0]._0_4_) +
                               (double)ref_cavity_1);
                uStack_690 = tri_normal[1] + uStack_690;
                local_688 = tri_normal[2] + local_688;
              }
              pRVar16 = pRVar23->ref_adj->item;
              iVar29 = pRVar16[iVar29].next;
              iVar25 = -1;
              if (iVar29 != -1) goto LAB_001f9561;
            }
            uVar9 = ref_math_normalize((REF_DBL *)&ref_cavity_1);
            dVar32 = local_6b8;
            pRVar27 = local_6e8;
            if (uVar9 == 0) {
              RVar31 = SUB84(local_6b8,0);
              uVar9 = ref_node_metric_get(local_6e8,RVar31,(REF_DBL *)&bc);
              if (uVar9 == 0) {
                dVar37 = (local_410 * local_688 +
                         local_428 * (double)ref_cavity_1 + uStack_690 * local_418) * local_688 +
                         (local_428 * local_688 +
                         (double)CONCAT44(iStack_434,bc) * (double)ref_cavity_1 +
                         (double)CONCAT44(iStack_42c,local_430) * uStack_690) * (double)ref_cavity_1
                         + (local_418 * local_688 +
                           (double)CONCAT44(iStack_42c,local_430) * (double)ref_cavity_1 +
                           local_420 * uStack_690) * uStack_690;
                if (dVar37 <= 0.0) {
                  pcVar28 = "ratio not positive";
                  uVar19 = 0x409;
                }
                else {
                  if (dVar37 < 0.0) {
                    dVar37 = sqrt(dVar37);
                  }
                  else {
                    dVar37 = SQRT(dVar37);
                  }
                  dVar38 = dVar37 * 1e+20;
                  if (dVar38 <= -dVar38) {
                    dVar38 = -dVar38;
                  }
                  if (1.0 < dVar38) {
                    local_6b0 = dVar37;
                    uVar9 = ref_node_next_global(pRVar27,&global);
                    if (uVar9 == 0) {
                      uVar9 = ref_node_add(pRVar27,CONCAT44(global._4_4_,(uint)global),&new_node);
                      if (uVar9 == 0) {
                        dVar37 = 1.0 / local_6b0;
                        lVar33 = (long)new_node;
                        *(REF_INT *)((long)local_6f8 + (long)dVar32 * 4) = new_node;
                        pRVar3 = pRVar27->real;
                        pRVar3[lVar33 * 0xf] =
                             (double)ref_cavity_1 * dVar37 + pRVar3[(long)dVar32 * 0xf];
                        pRVar3[lVar33 * 0xf + 1] =
                             uStack_690 * dVar37 + pRVar3[(long)dVar32 * 0xf + 1];
                        pRVar3[lVar33 * 0xf + 2] =
                             dVar37 * local_688 + pRVar3[(long)dVar32 * 0xf + 2];
                        if ((int)local_6e0 == 0) {
                          uVar9 = ref_cavity_create(&ref_cavity);
                          if (uVar9 == 0) {
                            uVar9 = ref_cavity_form_insert_tet
                                              ((REF_CAVITY)
                                               CONCAT44(ref_cavity._4_4_,(int)ref_cavity),ref_grid,
                                               new_node,RVar31,-1);
                            if (uVar9 == 0) {
                              uVar9 = ref_cavity_enlarge_combined
                                                ((REF_CAVITY)
                                                 CONCAT44(ref_cavity._4_4_,(int)ref_cavity));
                              if (uVar9 == 0) {
                                uVar9 = ref_cavity_replace((REF_CAVITY)
                                                           CONCAT44(ref_cavity._4_4_,(int)ref_cavity
                                                                   ));
                                if (uVar9 == 0) {
                                  uVar9 = ref_cavity_free((REF_CAVITY)
                                                          CONCAT44(ref_cavity._4_4_,(int)ref_cavity)
                                                         );
                                  pvVar14 = local_6c8;
                                  if (uVar9 != 0) {
                                    uStackY_720 = (ulong)uVar9;
                                    pcVar28 = "cav free";
                                    uVar19 = 0x463;
                                    goto LAB_001f990f;
                                  }
                                  goto LAB_001f98be;
                                }
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                       ,0x462,"ref_layer_prism_insert_hair",(ulong)uVar9,
                                       "cav replace");
                                ref_cavity_tec((REF_CAVITY)
                                               CONCAT44(ref_cavity._4_4_,(int)ref_cavity),
                                               "ref_layer_prism_cavity.tec");
                                pcVar28 = "ref_layer_prism_mesh.tec";
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                       ,0x45e,"ref_layer_prism_insert_hair",(ulong)uVar9,"enlarge");
                                ref_cavity_tec((REF_CAVITY)
                                               CONCAT44(ref_cavity._4_4_,(int)ref_cavity),
                                               "cav-fail.tec");
                                pcVar28 = "mesh-fail.tec";
                              }
                              uStackY_720 = (ulong)uVar9;
                              ref_export_by_extension(ref_grid,pcVar28);
                              goto LAB_001f9e23;
                            }
                            uStackY_720 = (ulong)uVar9;
                            pcVar28 = "ball";
                            uVar19 = 0x45a;
                          }
                          else {
                            uStackY_720 = (ulong)uVar9;
                            pcVar28 = "cav create";
                            uVar19 = 0x457;
                          }
                        }
                        else {
                          ref_geom = ref_grid->geom;
                          uVar9 = ref_geom_tuv(ref_geom,RVar31,2,iVar30,(REF_DBL *)&has_side);
                          pRVar27 = local_6e8;
                          if (uVar9 == 0) {
                            uVar9 = ref_egads_inverse_eval
                                              (ref_geom,2,iVar30,
                                               local_6e8->real + (long)new_node * 0xf,
                                               (REF_DBL *)&has_side);
                            if (uVar9 == 0) {
                              uVar9 = ref_egads_eval_at(ref_geom,2,iVar30,(REF_DBL *)&has_side,
                                                        pRVar27->real + (long)new_node * 0xf,
                                                        (REF_DBL *)0x0);
                              if (uVar9 == 0) {
                                uVar9 = ref_geom_add(ref_geom,new_node,2,iVar30,(REF_DBL *)&has_side
                                                    );
                                dVar32 = local_6b8;
                                if (uVar9 == 0) {
                                  *(undefined4 *)((long)local_6f8 + (long)local_6b8 * 4) =
                                       0xffffffff;
                                  uVar9 = ref_geom_remove_all(ref_geom,new_node);
                                  pRVar27 = local_6e8;
                                  if (uVar9 == 0) {
                                    uVar9 = ref_node_remove(local_6e8,new_node);
                                    pvVar14 = local_6c8;
                                    if (uVar9 != 0) {
                                      uStackY_720 = (ulong)uVar9;
                                      pcVar28 = "rm node";
                                      uVar19 = 0x429;
                                      goto LAB_001f990f;
                                    }
                                    goto LAB_001f98be;
                                  }
                                  uStackY_720 = (ulong)uVar9;
                                  pcVar28 = "rm geom";
                                  uVar19 = 0x428;
                                }
                                else {
                                  uStackY_720 = (ulong)uVar9;
                                  pcVar28 = "add param";
                                  uVar19 = 0x425;
                                }
                              }
                              else {
                                uStackY_720 = (ulong)uVar9;
                                pcVar28 = "inv eval";
                                uVar19 = 0x422;
                              }
                            }
                            else {
                              uStackY_720 = (ulong)uVar9;
                              pcVar28 = "inv eval";
                              uVar19 = 0x41e;
                            }
                          }
                          else {
                            uStackY_720 = (ulong)uVar9;
                            pcVar28 = "base param";
                            uVar19 = 0x41b;
                          }
                        }
                      }
                      else {
                        uStackY_720 = (ulong)uVar9;
                        pcVar28 = "add";
                        uVar19 = 0x40e;
                      }
                    }
                    else {
                      uStackY_720 = (ulong)uVar9;
                      pcVar28 = "next global";
                      uVar19 = 0x40d;
                    }
                    goto LAB_001f990f;
                  }
                  pcVar28 = "1/ratio is inf 1/0";
                  uVar19 = 0x40b;
                }
LAB_001f9e19:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,uVar19,"ref_layer_prism_insert_hair",pcVar28);
                uStackY_720 = 1;
                goto LAB_001f9e23;
              }
              uStackY_720 = (ulong)uVar9;
              pcVar28 = "get";
              uVar19 = 0x407;
            }
            else {
              uStackY_720 = (ulong)uVar9;
              pcVar28 = "norm";
              uVar19 = 0x406;
            }
LAB_001f990f:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,uVar19,"ref_layer_prism_insert_hair",uStackY_720,pcVar28);
LAB_001f9e23:
            pcVar28 = "insert hair";
            uVar19 = 0x487;
            goto LAB_001f919f;
          }
LAB_001f98be:
        }
LAB_001f992f:
        iVar29 = 0;
        while( true ) {
          pRVar23 = local_6d0;
          iVar25 = local_6d0->max;
          if (iVar25 <= iVar29) break;
          RVar12 = ref_cell_nodes(local_6d0,iVar29,nodes);
          if ((((RVar12 == 0) && (*(int *)((long)local_6f8 + (long)nodes[0] * 4) != -1)) &&
              (*(int *)((long)local_6f8 + (long)nodes[1] * 4) != -1)) &&
             (*(int *)((long)local_6f8 + (long)nodes[2] * 4) != -1)) {
            lVar33 = 0;
            while (lVar33 < local_6d0->edge_per) {
              lVar17 = (long)local_6d0->size_per * (long)iVar29;
              uVar9 = *(uint *)((long)local_6f8 +
                               (long)local_6d0->c2n[local_6d0->e2n[lVar33 * 2] + lVar17] * 4);
              pRVar21 = (REF_DICT)(ulong)uVar9;
              RVar31 = *(REF_INT *)
                        ((long)local_6f8 +
                        (long)local_6d0->c2n
                              [(long)(int)lVar17 + (long)local_6d0->e2n[lVar33 * 2 + 1]] * 4);
              local_6b0 = (double)CONCAT44(local_6b0._4_4_,RVar31);
              local_620 = lVar33;
              uVar13 = ref_cell_has_side(ref_grid->cell[8],uVar9,RVar31,&has_side);
              if (uVar13 != 0) {
                uStackY_720 = (ulong)uVar13;
                pcVar28 = "find tet side";
                uVar19 = 0x493;
                goto LAB_001f919f;
              }
              if (has_side == 0) {
                pRVar23 = ref_grid->cell[8];
                uVar15 = 0xffffffff;
                RVar31 = -1;
                if (-1 < (int)uVar9) {
                  pRVar2 = pRVar23->ref_adj;
                  uVar15 = 0xffffffff;
                  RVar31 = -1;
                  if ((int)uVar9 < pRVar2->nnode) {
                    uVar9 = pRVar2->first[(long)pRVar21];
                    uVar15 = 0xffffffff;
                    RVar31 = -1;
                    if ((long)(int)uVar9 != -1) {
                      RVar31 = pRVar2->item[(int)uVar9].ref;
                      uVar15 = (ulong)uVar9;
                    }
                  }
                }
                pRVar27 = ref_grid->node;
                local_6b8 = -1e+200;
                local_6f0 = pRVar21;
                local_6e8 = pRVar27;
                local_6bc = -1;
                while ((int)uVar15 != -1) {
                  lVar33 = 4;
                  lVar17 = 0;
                  local_6a0 = RVar31;
                  while( true ) {
                    if (pRVar23->face_per <= lVar17) break;
                    pRVar4 = pRVar23->f2n;
                    pRVar5 = pRVar23->c2n;
                    lVar22 = (long)RVar31;
                    lVar20 = pRVar23->size_per * lVar22;
                    iVar25 = (int)pRVar21;
                    if (((pRVar5[*(int *)((long)pRVar4 + lVar33 + -4) + lVar20] != iVar25) &&
                        (lVar20 = (long)(int)lVar20,
                        pRVar5[*(int *)((long)pRVar4 + lVar33) + lVar20] != iVar25)) &&
                       (pRVar5[*(int *)((long)pRVar4 + lVar33 + 4) + lVar20] != iVar25)) {
                      iVar30 = local_6b0._0_4_;
                      iStack_434 = local_6b0._0_4_;
                      local_430 = pRVar5[*(int *)((long)pRVar4 + lVar33) + lVar20];
                      iStack_42c = pRVar5[*(int *)((long)pRVar4 + lVar33 + -4) + lVar20];
                      bc = iVar25;
                      uVar9 = ref_node_tet_vol(pRVar27,&bc,tri_normal);
                      if (uVar9 == 0) {
                        local_6e0 = (double)CONCAT44(tri_normal[0]._4_4_,tri_normal[0]._0_4_);
                        bc = (REF_INT)local_6f0;
                        iStack_434 = iVar30;
                        lVar20 = pRVar23->size_per * lVar22;
                        local_430 = pRVar23->c2n[*(int *)((long)pRVar23->f2n + lVar33 + 4) + lVar20]
                        ;
                        iStack_42c = pRVar23->c2n
                                     [(long)(int)lVar20 +
                                      (long)*(int *)((long)pRVar23->f2n + lVar33)];
                        uVar9 = ref_node_tet_vol(local_6e8,&bc,tri_normal);
                        pRVar27 = local_6e8;
                        if (uVar9 == 0) {
                          local_6a8 = (double)CONCAT44(tri_normal[0]._4_4_,tri_normal[0]._0_4_);
                          bc = (REF_INT)local_6f0;
                          iStack_434 = iVar30;
                          lVar22 = pRVar23->size_per * lVar22;
                          local_430 = pRVar23->c2n
                                      [*(int *)((long)pRVar23->f2n + lVar33 + -4) + lVar22];
                          iStack_42c = pRVar23->c2n
                                       [(long)(int)lVar22 +
                                        (long)*(int *)((long)pRVar23->f2n + lVar33 + 4)];
                          uVar9 = ref_node_tet_vol(local_6e8,&bc,tri_normal);
                          if (uVar9 == 0) {
                            dVar32 = 1e+200;
                            if (local_6e0 <= 1e+200) {
                              dVar32 = local_6e0;
                            }
                            if (local_6a8 <= dVar32) {
                              dVar32 = local_6a8;
                            }
                            if ((double)CONCAT44(tri_normal[0]._4_4_,tri_normal[0]._0_4_) <= dVar32)
                            {
                              dVar32 = (double)CONCAT44(tri_normal[0]._4_4_,tri_normal[0]._0_4_);
                            }
                            pRVar21 = local_6f0;
                            RVar31 = local_6a0;
                            if (local_6b8 < dVar32) {
                              local_6bc = local_6a0;
                              local_6b8 = dVar32;
                            }
                            goto LAB_001f9cc9;
                          }
                          uStackY_720 = (ulong)uVar9;
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x34f,"ref_layer_seed_tet",(ulong)uVar9,"vol");
                          goto LAB_001fa1ca;
                        }
                        uVar19 = 0x349;
                      }
                      else {
                        uVar19 = 0x343;
                      }
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,uVar19,"ref_layer_seed_tet",(ulong)uVar9,"vol");
                      uStackY_720 = (ulong)uVar9;
                      goto LAB_001fa1ca;
                    }
LAB_001f9cc9:
                    lVar17 = lVar17 + 1;
                    lVar33 = lVar33 + 0x10;
                  }
                  pRVar16 = pRVar23->ref_adj->item;
                  uVar15 = (ulong)pRVar16[(int)uVar15].next;
                  RVar31 = -1;
                  if (uVar15 != 0xffffffffffffffff) {
                    RVar31 = pRVar16[uVar15].ref;
                  }
                }
                if (local_6bc == -1) {
                  pcVar28 = "best tet empty";
                  uVar19 = 0x357;
                }
                else {
                  if (0.0 < local_6b8) {
                    uVar9 = ref_cavity_create(&ref_cavity_1);
                    if (uVar9 == 0) {
                      uVar9 = ref_cavity_form_empty(ref_cavity_1,ref_grid,local_6b0._0_4_);
                      if (uVar9 == 0) {
                        uVar9 = ref_cavity_add_tet(ref_cavity_1,local_6bc);
                        if (uVar9 == 0) {
                          if ((ulong)ref_cavity_1->state != 0) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x49c,"ref_layer_align_prism","add tet not unknown",0,
                                   (ulong)ref_cavity_1->state);
                            return 1;
                          }
                          uVar9 = ref_cavity_enlarge_visible(ref_cavity_1);
                          if (uVar9 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x4a0,"ref_layer_align_prism",(ulong)uVar9,"enlarge");
                            ref_cavity_tec(ref_cavity_1,"cav-fail.tec");
                            pcVar28 = "mesh-fail.tec";
LAB_001fb110:
                            ref_export_by_extension(ref_grid,pcVar28);
                            return uVar9;
                          }
                          if ((ulong)ref_cavity_1->state != 1) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x4a5,"ref_layer_align_prism","prism top not visible",1,
                                   (ulong)ref_cavity_1->state);
                            ref_cavity_tec(ref_cavity_1,"ref_layer_prism_cavity.tec");
                            ref_export_by_extension(ref_grid,"ref_layer_prism_mesh.tec");
                            return 1;
                          }
                          uVar9 = ref_cavity_replace(ref_cavity_1);
                          if (uVar9 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x4a9,"ref_layer_align_prism",(ulong)uVar9,"cav replace");
                            ref_cavity_tec(ref_cavity_1,"ref_layer_prism_cavity.tec");
                            pcVar28 = "ref_layer_prism_mesh.tec";
                            goto LAB_001fb110;
                          }
                          uVar9 = ref_cavity_free(ref_cavity_1);
                          if (uVar9 == 0) goto LAB_001f9a39;
                          uStackY_720 = (ulong)uVar9;
                          pcVar28 = "cav free";
                          uVar19 = 0x4aa;
                        }
                        else {
                          uStackY_720 = (ulong)uVar9;
                          pcVar28 = "add tet";
                          uVar19 = 0x49a;
                        }
                      }
                      else {
                        uStackY_720 = (ulong)uVar9;
                        pcVar28 = "empty";
                        uVar19 = 0x499;
                      }
                    }
                    else {
                      uStackY_720 = (ulong)uVar9;
                      pcVar28 = "cav create";
                      uVar19 = 0x498;
                    }
                    goto LAB_001f919f;
                  }
                  pcVar28 = "best vol not positive";
                  uVar19 = 0x358;
                }
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,uVar19,"ref_layer_seed_tet",pcVar28);
                uStackY_720 = 1;
LAB_001fa1ca:
                pcVar28 = "seed";
                uVar19 = 0x497;
                goto LAB_001f919f;
              }
LAB_001f9a39:
              lVar33 = local_620 + 1;
            }
          }
          iVar29 = iVar29 + 1;
        }
        for (iVar29 = 0; iVar29 < iVar25; iVar29 = iVar29 + 1) {
          RVar12 = ref_cell_nodes(pRVar23,iVar29,nodes);
          if ((((RVar12 == 0) && (*(int *)((long)local_6f8 + (long)nodes[0] * 4) != -1)) &&
              (*(int *)((long)local_6f8 + (long)nodes[1] * 4) != -1)) &&
             (*(int *)((long)local_6f8 + (long)nodes[2] * 4) != -1)) {
            local_6e0 = (double)(long)iVar29;
            for (lVar33 = 0; lVar33 < pRVar23->edge_per; lVar33 = lVar33 + 1) {
              lVar17 = (long)pRVar23->size_per * (long)local_6e0;
              uVar9 = ref_cell_has_side(ref_grid->cell[8],
                                        pRVar23->c2n[pRVar23->e2n[lVar33 * 2] + lVar17],
                                        *(REF_INT *)
                                         ((long)local_6f8 +
                                         (long)pRVar23->c2n
                                               [(long)(int)lVar17 +
                                                (long)pRVar23->e2n[lVar33 * 2 + 1]] * 4),&has_side);
              if (uVar9 != 0) {
                uStackY_720 = (ulong)uVar9;
                pcVar28 = "diag";
                uVar19 = 0x4c1;
                goto LAB_001f919f;
              }
              pRVar4 = pRVar23->c2n;
              pRVar5 = pRVar23->e2n;
              if (has_side == 0) {
                lVar17 = (long)(pRVar23->size_per * iVar29);
                lVar20 = pRVar5[lVar33 * 2 + 1] + lVar17;
                lVar17 = pRVar5[lVar33 * 2] + lVar17;
                iVar25 = -1;
                iVar30 = iVar25;
                iVar1 = iVar25;
                iVar8 = iVar25;
              }
              else {
                lVar20 = (long)(pRVar23->size_per * iVar29);
                lVar17 = pRVar5[lVar33 * 2] + lVar20;
                iVar25 = pRVar4[lVar17];
                lVar20 = pRVar5[lVar33 * 2 + 1] + lVar20;
                iVar30 = pRVar4[lVar20];
                iVar1 = *(int *)((long)local_6f8 + (long)pRVar4[lVar20] * 4);
                iVar8 = *(int *)((long)local_6f8 + (long)iVar25 * 4);
              }
              local_6e8 = (REF_NODE)CONCAT44(local_6e8._4_4_,iVar8);
              local_6f0 = (REF_DICT)CONCAT44(local_6f0._4_4_,iVar1);
              uVar9 = ref_cell_has_side(ref_grid->cell[8],pRVar4[lVar20],
                                        *(REF_INT *)((long)local_6f8 + (long)pRVar4[lVar17] * 4),
                                        &has_side);
              if (uVar9 != 0) {
                uStackY_720 = (ulong)uVar9;
                pcVar28 = "diag";
                uVar19 = 0x4cd;
                goto LAB_001f919f;
              }
              if (has_side != 0) {
                lVar17 = (long)pRVar23->size_per * (long)local_6e0;
                iVar25 = pRVar23->c2n[pRVar23->e2n[lVar33 * 2 + 1] + lVar17];
                iVar30 = pRVar23->c2n[(long)(int)lVar17 + (long)pRVar23->e2n[lVar33 * 2]];
                local_6f0 = (REF_DICT)
                            CONCAT44(local_6f0._4_4_,
                                     *(undefined4 *)((long)local_6f8 + (long)iVar30 * 4));
                local_6e8 = (REF_NODE)
                            CONCAT44(local_6e8._4_4_,
                                     *(undefined4 *)((long)local_6f8 + (long)iVar25 * 4));
              }
              if (iVar25 == -1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x4d4,"ref_layer_align_prism","diag not found");
                return 1;
              }
              local_430 = (REF_INT)local_6f0;
              bc = iVar25;
              iStack_434 = iVar30;
              iStack_42c = iVar25;
              uVar9 = ref_cell_with_face(ref_grid->cell[8],&bc,(REF_INT *)tri_normal,
                                         (REF_INT *)&ref_cavity_1);
              if (uVar9 != 0) {
                uStackY_720 = (ulong)uVar9;
                pcVar28 = "tets";
                uVar19 = 0x4db;
                goto LAB_001f919f;
              }
              if ((tri_normal[0]._0_4_ == 0xffffffff) && ((int)ref_cavity_1 == -1)) {
                uVar9 = ref_layer_recover_face(ref_grid,&bc);
                if (uVar9 != 0) {
                  uStackY_720 = (ulong)uVar9;
                  pcVar28 = "recover upper";
                  uVar19 = 0x4dd;
                  goto LAB_001f919f;
                }
                printf("lower tets %d %d\n",(ulong)tri_normal[0]._0_4_,
                       (ulong)ref_cavity_1 & 0xffffffff);
              }
              iStack_434 = (REF_INT)local_6f0;
              local_430 = (REF_INT)local_6e8;
              bc = iVar25;
              iStack_42c = iVar25;
              uVar9 = ref_cell_with_face(ref_grid->cell[8],&bc,(REF_INT *)tri_normal,
                                         (REF_INT *)&ref_cavity_1);
              if (uVar9 != 0) {
                uStackY_720 = (ulong)uVar9;
                pcVar28 = "tets";
                uVar19 = 0x4e6;
                goto LAB_001f919f;
              }
              if ((tri_normal[0]._0_4_ == 0xffffffff) && ((int)ref_cavity_1 == -1)) {
                uVar9 = ref_layer_recover_face(ref_grid,&bc);
                if (uVar9 != 0) {
                  uStackY_720 = (ulong)uVar9;
                  pcVar28 = "recover upper";
                  uVar19 = 0x4e8;
                  goto LAB_001f919f;
                }
                printf("upper tets %d %d\n",(ulong)tri_normal[0]._0_4_,
                       (ulong)ref_cavity_1 & 0xffffffff);
              }
            }
          }
          iVar25 = pRVar23->max;
        }
        pvVar14 = local_6f8;
        for (dVar32 = 0.0; pRVar23 = local_6d0, iVar29 = SUB84(dVar32,0), iVar29 < iVar25;
            dVar32 = (double)(ulong)(SUB84(dVar32,0) + 1)) {
          RVar12 = ref_cell_nodes(local_6d0,iVar29,nodes);
          if ((((RVar12 == 0) && (*(int *)((long)pvVar14 + (long)nodes[0] * 4) != -1)) &&
              (*(int *)((long)pvVar14 + (long)nodes[1] * 4) != -1)) &&
             (*(int *)((long)pvVar14 + (long)nodes[2] * 4) != -1)) {
            local_6e8 = (REF_NODE)(long)iVar29;
            pRVar21 = (REF_DICT)0x0;
            local_6e0 = dVar32;
            while (pRVar23 = local_6d0, dVar32 = local_6e0,
                  (long)pRVar21 < (long)local_6d0->edge_per) {
              lVar33 = (long)local_6d0->size_per * (long)local_6e8;
              iVar29 = local_6d0->c2n[local_6d0->e2n[(long)pRVar21 * 2] + lVar33];
              iVar25 = local_6d0->c2n
                       [(long)(int)lVar33 + (long)local_6d0->e2n[(long)pRVar21 * 2 + 1]];
              RVar31 = *(REF_INT *)((long)pvVar14 + (long)iVar25 * 4);
              RVar34 = *(REF_INT *)((long)pvVar14 + (long)iVar29 * 4);
              local_6f0 = pRVar21;
              uVar9 = ref_cell_has_side(ref_grid->cell[8],iVar29,RVar31,(REF_BOOL *)tri_normal);
              if (uVar9 != 0) {
                uStackY_720 = (ulong)uVar9;
                pcVar28 = "diag02";
                uVar19 = 0x4fe;
                goto LAB_001f919f;
              }
              uVar9 = ref_cell_has_side(ref_grid->cell[8],iVar25,RVar34,(REF_BOOL *)&ref_cavity_1);
              if (uVar9 != 0) {
                uStackY_720 = (ulong)uVar9;
                pcVar28 = "diag13";
                uVar19 = 0x501;
                goto LAB_001f919f;
              }
              if ((tri_normal[0]._0_4_ != 0) && ((int)ref_cavity_1 != 0)) {
                puts("sliver");
                uVar9 = ref_layer_swap(ref_grid,iVar29,RVar31,iVar25,&bc);
                if (uVar9 != 0) {
                  uStackY_720 = (ulong)uVar9;
                  pcVar28 = "quad1";
                  uVar19 = 0x3d0;
LAB_001fb7b8:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,uVar19,"ref_layer_remove_sliver",uStackY_720,pcVar28);
                  pcVar28 = "remove sliver";
                  uVar19 = 0x504;
                  goto LAB_001f919f;
                }
                if (bc == 0) {
                  uVar9 = ref_layer_swap(ref_grid,iVar29,RVar31,RVar34,&bc);
                  if (uVar9 != 0) {
                    uStackY_720 = (ulong)uVar9;
                    pcVar28 = "quad1";
                    uVar19 = 0x3d2;
                    goto LAB_001fb7b8;
                  }
                  if (bc == 0) {
                    uVar9 = ref_layer_swap(ref_grid,iVar25,RVar34,iVar29,&bc);
                    if (uVar9 != 0) {
                      uStackY_720 = (ulong)uVar9;
                      pcVar28 = "quad0";
                      uVar19 = 0x3d4;
                      goto LAB_001fb7b8;
                    }
                    if (bc == 0) {
                      uVar9 = ref_layer_swap(ref_grid,iVar25,RVar34,RVar31,&bc);
                      if (uVar9 != 0) {
                        uStackY_720 = (ulong)uVar9;
                        pcVar28 = "quad3";
                        uVar19 = 0x3d6;
                        goto LAB_001fb7b8;
                      }
                    }
                  }
                }
              }
              pvVar14 = local_6f8;
              pRVar21 = (REF_DICT)((long)&local_6f0->n + 1);
            }
          }
          iVar25 = pRVar23->max;
        }
        uVar9 = ref_adj_create((REF_ADJ *)&has_side);
        if (uVar9 == 0) {
          uVar15 = 0;
          pRVar23 = local_6d0;
LAB_001fa8a8:
          if ((long)uVar15 < (long)pRVar23->max) {
            RVar31 = (REF_INT)uVar15;
            RVar12 = ref_cell_nodes(pRVar23,RVar31,nodes);
            if (RVar12 == 0) {
              iVar29 = *(int *)((long)local_6f8 + (long)nodes[0] * 4);
              if (((iVar29 != -1) &&
                  (iVar25 = *(int *)((long)local_6f8 + (long)nodes[1] * 4), iVar25 != -1)) &&
                 (iVar30 = *(int *)((long)local_6f8 + (long)nodes[2] * 4), iVar30 != -1)) {
                pRVar23 = ref_grid->cell[8];
                ref_cavity_1._0_4_ = nodes[0];
                ref_cavity_1._4_4_ = nodes[1];
                uStack_690._0_4_ = nodes[2];
                local_688 = (double)CONCAT44(iVar30,iVar25);
                RVar34 = -1;
                local_6f0 = (REF_DICT)0xffffffff;
                uStack_690._4_4_ = iVar29;
                if (-1 < nodes[0]) {
                  pRVar2 = pRVar23->ref_adj;
                  local_6f0 = (REF_DICT)0xffffffff;
                  if (nodes[0] < pRVar2->nnode) {
                    uVar9 = pRVar2->first[nodes[0]];
                    local_6f0 = (REF_DICT)0xffffffff;
                    if ((long)(int)uVar9 != -1) {
                      RVar34 = pRVar2->item[(int)uVar9].ref;
                      local_6f0 = (REF_DICT)(ulong)uVar9;
                    }
                  }
                }
                while ((int)local_6f0 != -1) {
                  for (lVar33 = 0; (int)lVar33 < pRVar23->node_per; lVar33 = lVar33 + 1) {
                    if (*(int *)((long)local_6f8 + (long)nodes[0] * 4) ==
                        pRVar23->c2n[(long)RVar34 * (long)pRVar23->size_per + lVar33]) {
                      uVar9 = ref_cell_nodes(pRVar23,RVar34,(REF_INT *)tri_normal);
                      if (uVar9 != 0) {
                        pcVar28 = "tet";
                        uVar19 = 0x51e;
LAB_001fb141:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,uVar19,"ref_layer_align_prism",(ulong)uVar9,pcVar28);
                        return uVar9;
                      }
                      uVar9 = ref_layer_tet_prism((REF_INT *)&ref_cavity_1,(REF_INT *)tri_normal,
                                                  &new_node);
                      if (uVar9 != 0) {
                        uVar19 = 0x51f;
LAB_001faed8:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,uVar19,"ref_layer_align_prism",(ulong)uVar9,"contains");
                        return 1;
                      }
                      if ((new_node != 0) &&
                         (uVar9 = ref_adj_add_uniquely
                                            ((REF_ADJ)CONCAT44(iStack_514,has_side),RVar31,RVar34),
                         uVar9 != 0)) {
                        pcVar28 = "add";
                        uVar19 = 0x521;
                        goto LAB_001fb141;
                      }
                    }
                  }
                  pRVar16 = pRVar23->ref_adj->item;
                  local_6f0 = (REF_DICT)(long)pRVar16[(REF_INT)local_6f0].next;
                  RVar34 = -1;
                  if (local_6f0 != (REF_DICT)0xffffffffffffffff) {
                    RVar34 = pRVar16[(long)local_6f0].ref;
                  }
                }
                RVar34 = -1;
                iVar29 = -1;
                if ((long)nodes[1] < 0) goto LAB_001faa90;
                pRVar2 = pRVar23->ref_adj;
                RVar34 = -1;
                if (pRVar2->nnode <= nodes[1]) goto LAB_001faa90;
                iVar25 = pRVar2->first[nodes[1]];
                RVar34 = -1;
                iVar29 = -1;
                if (iVar25 == -1) goto LAB_001faa90;
                pRVar16 = pRVar2->item;
LAB_001faa84:
                RVar34 = pRVar16[iVar25].ref;
                iVar29 = iVar25;
LAB_001faa90:
                if (iVar29 != -1) {
                  lVar33 = 0;
LAB_001faa9c:
                  if (pRVar23->node_per <= (int)lVar33) goto LAB_001fab34;
                  if (*(int *)((long)local_6f8 + (long)nodes[1] * 4) !=
                      pRVar23->c2n[(long)RVar34 * (long)pRVar23->size_per + lVar33]) {
LAB_001fab2c:
                    lVar33 = lVar33 + 1;
                    goto LAB_001faa9c;
                  }
                  uVar9 = ref_cell_nodes(pRVar23,RVar34,(REF_INT *)tri_normal);
                  if (uVar9 == 0) {
                    uVar9 = ref_layer_tet_prism((REF_INT *)&ref_cavity_1,(REF_INT *)tri_normal,
                                                &new_node);
                    if (uVar9 != 0) {
                      uVar19 = 0x527;
                      goto LAB_001faed8;
                    }
                    if ((new_node != 0) &&
                       (uVar9 = ref_adj_add_uniquely
                                          ((REF_ADJ)CONCAT44(iStack_514,has_side),RVar31,RVar34),
                       uVar9 != 0)) {
                      uStackY_720 = (ulong)uVar9;
                      pcVar28 = "add";
                      uVar19 = 0x529;
                      goto LAB_001fb858;
                    }
                    goto LAB_001fab2c;
                  }
                  uStackY_720 = (ulong)uVar9;
                  pcVar28 = "tet";
                  uVar19 = 0x526;
LAB_001fb858:
                  goto LAB_001f919f;
                }
                RVar34 = -1;
                iVar29 = -1;
                if ((long)nodes[2] < 0) goto LAB_001fab94;
                pRVar2 = pRVar23->ref_adj;
                RVar34 = -1;
                if (pRVar2->nnode <= nodes[2]) goto LAB_001fab94;
                iVar25 = pRVar2->first[nodes[2]];
                RVar34 = -1;
                iVar29 = -1;
                if (iVar25 == -1) goto LAB_001fab94;
                pRVar16 = pRVar2->item;
                goto LAB_001fab88;
              }
            }
            goto LAB_001fa8c7;
          }
          uVar9 = ref_adj_free((REF_ADJ)CONCAT44(iStack_514,has_side));
          if (uVar9 == 0) {
            local_6f0 = (REF_DICT)((ulong)local_6f0 & 0xffffffff00000000);
            while( true ) {
              if (ref_grid->cell[10]->max <= (REF_INT)local_6f0) break;
              RVar12 = ref_cell_nodes(ref_grid->cell[10],(REF_INT)local_6f0,nodes);
              if (RVar12 == 0) {
                lVar33 = (long)(REF_INT)local_6f0;
                local_6e8 = (REF_NODE)0x0;
                while ((long)local_6e8 < (long)ref_grid->cell[10]->face_per) {
                  uVar9 = ref_cavity_create((REF_CAVITY *)&global);
                  if (uVar9 != 0) {
                    uStackY_720 = (ulong)uVar9;
                    pcVar28 = "cav create";
                    uVar19 = 0x555;
                    goto LAB_001f919f;
                  }
                  uVar9 = ref_cavity_form_empty
                                    ((REF_CAVITY)CONCAT44(global._4_4_,(uint)global),ref_grid,-1);
                  if (uVar9 != 0) {
                    uStackY_720 = (ulong)uVar9;
                    pcVar28 = "empty";
                    uVar19 = 0x556;
                    goto LAB_001f919f;
                  }
                  pRVar23 = ref_grid->cell[10];
                  local_6e0 = (double)((long)local_6e8 * 4);
                  lVar17 = pRVar23->size_per * lVar33;
                  uVar9 = pRVar23->c2n[pRVar23->f2n[(long)local_6e8 * 4] + lVar17];
                  if (uVar9 != pRVar23->c2n
                               [(long)(int)lVar17 + (long)pRVar23->f2n[(long)local_6e8 * 4 + 3]]) {
                    iVar29 = -1;
                    uVar15 = 0xffffffff;
                    if (-1 < (int)uVar9) {
                      pRVar2 = ref_grid->cell[8]->ref_adj;
                      uVar15 = 0xffffffff;
                      if ((int)uVar9 < pRVar2->nnode) {
                        uVar9 = pRVar2->first[uVar9];
                        uVar15 = 0xffffffff;
                        if ((long)(int)uVar9 != -1) {
                          iVar29 = pRVar2->item[(int)uVar9].ref;
                          uVar15 = (ulong)uVar9;
                        }
                      }
                    }
                    local_6d0 = (REF_CELL)((long)local_6e8 * 4 + 3);
                    uVar18 = (ulong)local_6e0 | 2;
                    do {
                      if ((int)uVar15 == -1) {
                        pRVar23 = ref_grid->cell[10];
                        iVar29 = pRVar23->c2n
                                 [pRVar23->size_per * lVar33 +
                                  (long)pRVar23->f2n[(long)local_6e0 + 1]];
                        iVar25 = -1;
                        iVar30 = -1;
                        if ((long)iVar29 < 0) goto LAB_001fb6ce;
                        pRVar2 = ref_grid->cell[8]->ref_adj;
                        iVar25 = -1;
                        if (pRVar2->nnode <= iVar29) goto LAB_001fb6ce;
                        iVar29 = pRVar2->first[iVar29];
                        iVar25 = -1;
                        iVar30 = -1;
                        if (iVar29 == -1) goto LAB_001fb6ce;
                        pRVar16 = pRVar2->item;
                        do {
                          iVar25 = pRVar16[iVar29].ref;
                          iVar30 = iVar29;
LAB_001fb6ce:
                          do {
                            if (iVar30 == -1) goto LAB_001fb24f;
                            for (lVar17 = 0; pRVar23 = ref_grid->cell[8],
                                (int)lVar17 < pRVar23->node_per; lVar17 = lVar17 + 1) {
                              pRVar6 = ref_grid->cell[10];
                              if (pRVar6->c2n
                                  [pRVar6->size_per * lVar33 + (long)pRVar6->f2n[(long)local_6d0]]
                                  == pRVar23->c2n[(long)iVar25 * (long)pRVar23->size_per + lVar17])
                              {
                                uVar9 = ref_cavity_add_tet((REF_CAVITY)
                                                           CONCAT44(global._4_4_,(uint)global),
                                                           iVar25);
                                if (uVar9 != 0) {
                                  uStackY_720 = (ulong)uVar9;
                                  pcVar28 = "add tet";
                                  uVar19 = 0x565;
                                  goto LAB_001f919f;
                                }
                              }
                            }
                            pRVar16 = pRVar23->ref_adj->item;
                            iVar29 = pRVar16[iVar30].next;
                            iVar25 = -1;
                            iVar30 = iVar29;
                          } while (iVar29 == -1);
                        } while( true );
                      }
                      for (lVar17 = 0; pRVar23 = ref_grid->cell[8], (int)lVar17 < pRVar23->node_per;
                          lVar17 = lVar17 + 1) {
                        pRVar6 = ref_grid->cell[10];
                        if (pRVar6->c2n[pRVar6->size_per * lVar33 + (long)pRVar6->f2n[uVar18]] ==
                            pRVar23->c2n[(long)iVar29 * (long)pRVar23->size_per + lVar17]) {
                          uVar9 = ref_cavity_add_tet((REF_CAVITY)CONCAT44(global._4_4_,(uint)global)
                                                     ,iVar29);
                          if (uVar9 != 0) {
                            uStackY_720 = (ulong)uVar9;
                            pcVar28 = "add tet";
                            uVar19 = 0x55e;
                            goto LAB_001f919f;
                          }
                        }
                      }
                      pRVar16 = pRVar23->ref_adj->item;
                      uVar15 = (ulong)pRVar16[(int)uVar15].next;
                      iVar29 = -1;
                      if (uVar15 != 0xffffffffffffffff) {
                        iVar29 = pRVar16[uVar15].ref;
                      }
                    } while( true );
                  }
LAB_001fb24f:
                  ref_cavity_00 = (REF_CAVITY)CONCAT44(global._4_4_,(uint)global);
                  if ((ref_cavity_00->tet_list->n & 0xfffffffdU) != 0) {
                    snprintf((char *)&bc,0x400,"glue-%d-%d-cav.tec",(ulong)local_6f0 & 0xffffffff,
                             local_6e8);
                    printf("pyramid tets missing %d %s\n",
                           (ulong)**(uint **)(CONCAT44(global._4_4_,(uint)global) + 0x50),&bc);
                    ref_cavity_00 = (REF_CAVITY)CONCAT44(global._4_4_,(uint)global);
                    if (0 < ref_cavity_00->nface) {
                      uVar9 = ref_cavity_tec(ref_cavity_00,(char *)&bc);
                      if (uVar9 != 0) {
                        uStackY_720 = (ulong)uVar9;
                        pcVar28 = "cav tec";
                        uVar19 = 0x56e;
                        goto LAB_001f919f;
                      }
                      ref_cavity_00 = (REF_CAVITY)CONCAT44(global._4_4_,(uint)global);
                    }
                  }
                  if (ref_cavity_00->tet_list->n == 2) {
                    pRVar4 = ref_cavity_00->tet_list->value;
                    RVar31 = *pRVar4;
                    RVar34 = pRVar4[1];
                    uVar9 = ref_cell_nodes(ref_grid->cell[10],(REF_INT)local_6f0,
                                           (REF_INT *)tri_normal);
                    if (uVar9 == 0) {
                      uVar9 = ref_cell_nodes(ref_grid->cell[8],RVar31,(REF_INT *)&ref_cavity_1);
                      if (uVar9 != 0) {
                        uStackY_720 = (ulong)uVar9;
                        pcVar28 = "tet0 nodes";
                        uVar19 = 0x2f0;
                        goto LAB_001fbc13;
                      }
                      uVar9 = ref_cell_nodes(ref_grid->cell[8],RVar34,&has_side);
                      if (uVar9 != 0) {
                        uStackY_720 = (ulong)uVar9;
                        pcVar28 = "tet1 nodes";
                        uVar19 = 0x2f1;
                        goto LAB_001fbc13;
                      }
                      pRVar23 = ref_grid->cell[10];
                      uVar15 = (ulong)(uint)pRVar23->face_per;
                      if (pRVar23->face_per < 1) {
                        uVar15 = 0;
                      }
                      uVar18 = 0xffffffffffffffff;
                      for (uVar26 = 0; iVar29 = (int)uVar18, uVar26 != uVar15; uVar26 = uVar26 + 1)
                      {
                        pRVar4 = pRVar23->f2n;
                        if (pRVar4[uVar26 * 4] != pRVar4[uVar26 * 4 + 3]) {
                          uVar24 = 0;
                          for (lVar17 = 0; iVar25 = (int)uVar24, lVar17 != 4; lVar17 = lVar17 + 1) {
                            iVar30 = *(int *)((long)tri_normal +
                                             (long)pRVar4[(ulong)((uint)uVar26 & 0x3fffffff) * 4 +
                                                          lVar17] * 4);
                            auVar40._0_4_ = -(uint)(iVar30 == (int)ref_cavity_1);
                            auVar40._4_4_ = -(uint)(iVar30 == ref_cavity_1._4_4_);
                            auVar40._8_4_ = -(uint)(iVar30 == (REF_INT)uStack_690);
                            auVar40._12_4_ = -(uint)(iVar30 == uStack_690._4_4_);
                            auVar39._0_4_ = -(uint)(iVar30 == has_side);
                            auVar39._4_4_ = -(uint)(iVar30 == iStack_514);
                            auVar39._8_4_ = -(uint)(iVar30 == (int)uStack_510);
                            auVar39._12_4_ = -(uint)(iVar30 == (int)((ulong)uStack_510 >> 0x20));
                            auVar39 = packssdw(auVar39,auVar40);
                            uVar24 = (ulong)((iVar25 + 1) -
                                            (uint)((((((((((((((((auVar39 >> 7 &
                                                                 (undefined1  [16])0x1) ==
                                                                 (undefined1  [16])0x0 &&
                                                                (auVar39 >> 0xf &
                                                                (undefined1  [16])0x1) ==
                                                                (undefined1  [16])0x0) &&
                                                               (auVar39 >> 0x17 &
                                                               (undefined1  [16])0x1) ==
                                                               (undefined1  [16])0x0) &&
                                                              (auVar39 >> 0x1f &
                                                              (undefined1  [16])0x1) ==
                                                              (undefined1  [16])0x0) &&
                                                             (auVar39 >> 0x27 &
                                                             (undefined1  [16])0x1) ==
                                                             (undefined1  [16])0x0) &&
                                                            (auVar39 >> 0x2f & (undefined1  [16])0x1
                                                            ) == (undefined1  [16])0x0) &&
                                                           (auVar39 >> 0x37 & (undefined1  [16])0x1)
                                                           == (undefined1  [16])0x0) &&
                                                          (auVar39 >> 0x3f & (undefined1  [16])0x1)
                                                          == (undefined1  [16])0x0) &&
                                                         (auVar39 >> 0x47 & (undefined1  [16])0x1)
                                                         == (undefined1  [16])0x0) &&
                                                        (auVar39 >> 0x4f & (undefined1  [16])0x1) ==
                                                        (undefined1  [16])0x0) &&
                                                       (auVar39 >> 0x57 & (undefined1  [16])0x1) ==
                                                       (undefined1  [16])0x0) &&
                                                      (auVar39 >> 0x5f & (undefined1  [16])0x1) ==
                                                      (undefined1  [16])0x0) &&
                                                     (auVar39 >> 0x67 & (undefined1  [16])0x1) ==
                                                     (undefined1  [16])0x0) &&
                                                    (auVar39 >> 0x6f & (undefined1  [16])0x1) ==
                                                    (undefined1  [16])0x0) &&
                                                   (auVar39 >> 0x77 & (undefined1  [16])0x1) ==
                                                   (undefined1  [16])0x0) && -1 < auVar39[0xf]));
                          }
                          if (iVar25 != 2) {
                            if (iVar25 != 4) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x302,"ref_layer_tet_to_pyr","hits not 2 or 4");
                              printf("hits %d\n",uVar24);
                              goto LAB_001fb986;
                            }
                            uVar18 = uVar26;
                            if (iVar29 != -1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x304,"ref_layer_tet_to_pyr","two quad faces",
                                     0xffffffffffffffff,(long)iVar29);
                              goto LAB_001fb986;
                            }
                          }
                        }
                        uVar18 = uVar18 & 0xffffffff;
                      }
                      if (iVar29 == -1) {
                        pcVar28 = "quad face not set";
                        uVar19 = 0x309;
                      }
                      else {
                        pRVar4 = pRVar23->f2n;
                        ref_cavity._0_4_ = *(int *)((long)tri_normal + (long)pRVar4[iVar29 * 4] * 4)
                        ;
                        ref_cavity._4_4_ =
                             *(int *)((long)tri_normal + (long)pRVar4[iVar29 * 4 + 1] * 4);
                        local_498 = *(int *)((long)tri_normal + (long)pRVar4[iVar29 * 4 + 2] * 4);
                        local_49c = *(int *)((long)tri_normal + (long)pRVar4[iVar29 * 4 + 3] * 4);
                        iVar29 = -1;
                        for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
                          iVar25 = *(int *)((long)&ref_cavity_1 + lVar17 * 4);
                          if (((((int)ref_cavity != iVar25) && (ref_cavity._4_4_ != iVar25)) &&
                              (local_498 != iVar25)) &&
                             ((local_49c != iVar25 &&
                              (bVar35 = iVar29 != -1, bVar36 = iVar29 != iVar25, iVar29 = iVar25,
                              bVar36 && bVar35)))) {
                            pcVar28 = "multiple off nodes";
                            uVar19 = 0x318;
                            goto LAB_001fb97f;
                          }
                          iVar25 = (&has_side)[lVar17];
                          if ((((int)ref_cavity != iVar25) && (ref_cavity._4_4_ != iVar25)) &&
                             ((local_498 != iVar25 &&
                              ((local_49c != iVar25 &&
                               (bVar35 = iVar29 != -1, bVar36 = iVar29 != iVar25, iVar29 = iVar25,
                               bVar36 && bVar35)))))) {
                            pcVar28 = "multiple off nodes";
                            uVar19 = 0x31e;
                            goto LAB_001fb97f;
                          }
                        }
                        local_4a0 = iVar29;
                        if (iVar29 != -1) {
                          uVar9 = ref_cell_remove(ref_grid->cell[8],RVar31);
                          if (uVar9 == 0) {
                            uVar9 = ref_cell_remove(ref_grid->cell[8],RVar34);
                            if (uVar9 == 0) {
                              uVar9 = ref_cell_add(ref_grid->cell[9],(REF_INT *)&ref_cavity,
                                                   &new_node);
                              if (uVar9 == 0) {
                                ref_cavity_00 = (REF_CAVITY)CONCAT44(global._4_4_,(uint)global);
                                goto LAB_001fb651;
                              }
                              uStackY_720 = (ulong)uVar9;
                              pcVar28 = "add pyr";
                              uVar19 = 0x327;
                            }
                            else {
                              uStackY_720 = (ulong)uVar9;
                              pcVar28 = "rm tet1";
                              uVar19 = 0x325;
                            }
                          }
                          else {
                            uStackY_720 = (ulong)uVar9;
                            pcVar28 = "rm tet0";
                            uVar19 = 0x324;
                          }
                          goto LAB_001fbc13;
                        }
                        pcVar28 = "pyramid peak not set";
                        uVar19 = 0x322;
                      }
LAB_001fb97f:
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,uVar19,"ref_layer_tet_to_pyr",pcVar28);
LAB_001fb986:
                      uStackY_720 = 1;
                    }
                    else {
                      uStackY_720 = (ulong)uVar9;
                      pcVar28 = "pri nodes";
                      uVar19 = 0x2ef;
LAB_001fbc13:
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,uVar19,"ref_layer_tet_to_pyr",uStackY_720,pcVar28);
                    }
                    pcVar28 = "tet2pyr";
                    uVar19 = 0x576;
                    goto LAB_001f919f;
                  }
LAB_001fb651:
                  uVar9 = ref_cavity_free(ref_cavity_00);
                  local_6e8 = (REF_NODE)((long)&local_6e8->n + 1);
                  if (uVar9 != 0) {
                    uStackY_720 = (ulong)uVar9;
                    pcVar28 = "cav free";
                    uVar19 = 0x578;
                    goto LAB_001f919f;
                  }
                }
              }
              local_6f0 = (REF_DICT)CONCAT44(local_6f0._4_4_,(REF_INT)local_6f0 + 1);
            }
            uVar9 = ref_export_by_extension(ref_grid,"ref_layer_prism_after.tec");
            if (uVar9 == 0) {
              free(local_6f8);
              free(local_6c8);
              return 0;
            }
            uStackY_720 = (ulong)uVar9;
            pcVar28 = "dump surf after";
            uVar19 = 0x57d;
          }
          else {
            uStackY_720 = (ulong)uVar9;
            pcVar28 = "free";
            uVar19 = 0x54d;
          }
          goto LAB_001f919f;
        }
        uStackY_720 = (ulong)uVar9;
        pcVar28 = "tet list";
        uVar19 = 0x50e;
        goto LAB_001f919f;
      }
      pcVar28 = "malloc off_node of REF_BOOL NULL";
      uVar19 = 0x478;
      goto LAB_001f937a;
    }
    pcVar28 = "malloc active of REF_BOOL NULL";
  }
  uVar19 = 0x477;
LAB_001f937a:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar19,
         "ref_layer_align_prism",pcVar28);
  return RVar12;
LAB_001fab88:
  RVar34 = pRVar16[iVar25].ref;
  iVar29 = iVar25;
LAB_001fab94:
  do {
    if (iVar29 == -1) {
      uVar9 = ref_adj_degree((REF_ADJ)CONCAT44(iStack_514,has_side),RVar31,(REF_INT *)&global);
      if (uVar9 != 0) {
        uStackY_720 = (ulong)uVar9;
        pcVar28 = "deg";
        uVar19 = 0x535;
        goto LAB_001f919f;
      }
      if ((uint)global == 3) goto LAB_001fac7c;
      uVar9 = ref_cavity_create(&ref_cavity);
      if (uVar9 != 0) {
        uStackY_720 = (ulong)uVar9;
        pcVar28 = "cav create";
        uVar19 = 0x539;
        goto LAB_001f919f;
      }
      uVar9 = ref_cavity_form_empty
                        ((REF_CAVITY)CONCAT44(ref_cavity._4_4_,(int)ref_cavity),ref_grid,-1);
      if (uVar9 != 0) {
        uStackY_720 = (ulong)uVar9;
        pcVar28 = "empty";
        uVar19 = 0x53a;
        goto LAB_001f919f;
      }
      piVar7 = (int *)CONCAT44(iStack_514,has_side);
      RVar31 = -1;
      iVar29 = -1;
      if ((long)*piVar7 <= (long)uVar15) goto LAB_001fad15;
      iVar25 = *(int *)(*(long *)(piVar7 + 2) + uVar15 * 4);
      RVar31 = -1;
      iVar29 = -1;
      if (iVar25 == -1) goto LAB_001fad15;
      lVar33 = *(long *)(piVar7 + 4);
      goto LAB_001fad49;
    }
    for (lVar33 = 0; (int)lVar33 < pRVar23->node_per; lVar33 = lVar33 + 1) {
      if (*(int *)((long)local_6f8 + (long)nodes[2] * 4) ==
          pRVar23->c2n[(long)RVar34 * (long)pRVar23->size_per + lVar33]) {
        uVar9 = ref_cell_nodes(pRVar23,RVar34,(REF_INT *)tri_normal);
        if (uVar9 != 0) {
          uStackY_720 = (ulong)uVar9;
          pcVar28 = "tet";
          uVar19 = 0x52e;
          goto LAB_001fb858;
        }
        uVar9 = ref_layer_tet_prism((REF_INT *)&ref_cavity_1,(REF_INT *)tri_normal,&new_node);
        if (uVar9 != 0) {
          uVar19 = 0x52f;
          goto LAB_001faed8;
        }
        if ((new_node != 0) &&
           (uVar9 = ref_adj_add_uniquely((REF_ADJ)CONCAT44(iStack_514,has_side),RVar31,RVar34),
           uVar9 != 0)) {
          uStackY_720 = (ulong)uVar9;
          pcVar28 = "add";
          uVar19 = 0x531;
          goto LAB_001fb858;
        }
      }
    }
    pRVar16 = pRVar23->ref_adj->item;
    iVar25 = pRVar16[iVar29].next;
    RVar34 = -1;
    iVar29 = iVar25;
  } while (iVar25 == -1);
  goto LAB_001fab88;
LAB_001fad49:
  RVar31 = *(REF_INT *)(lVar33 + 4 + (long)iVar25 * 8);
  iVar29 = iVar25;
LAB_001fad15:
  do {
    if (iVar29 == -1) {
      snprintf((char *)&bc,0x400,"prism-%d-cav.tec",uVar15 & 0xffffffff);
      printf("prism tets %d %s\n",(ulong)(uint)global,&bc);
      uVar9 = ref_cavity_tec((REF_CAVITY)CONCAT44(ref_cavity._4_4_,(int)ref_cavity),(char *)&bc);
      if (uVar9 != 0) {
        uStackY_720 = (ulong)uVar9;
        pcVar28 = "cav tec";
        uVar19 = 0x540;
        goto LAB_001f919f;
      }
      uVar9 = ref_cavity_free((REF_CAVITY)CONCAT44(ref_cavity._4_4_,(int)ref_cavity));
      if (uVar9 == 0) {
        if ((uint)global == 3) goto LAB_001fac7c;
        goto LAB_001fae2c;
      }
      uStackY_720 = (ulong)uVar9;
      pcVar28 = "cav free";
      uVar19 = 0x541;
      goto LAB_001f919f;
    }
    uVar9 = ref_cavity_add_tet((REF_CAVITY)CONCAT44(ref_cavity._4_4_,(int)ref_cavity),RVar31);
    if (uVar9 != 0) {
      uStackY_720 = (ulong)uVar9;
      pcVar28 = "add tet";
      uVar19 = 0x53c;
      goto LAB_001f919f;
    }
    lVar33 = *(long *)(CONCAT44(iStack_514,has_side) + 0x10);
    iVar25 = *(int *)(lVar33 + (long)iVar29 * 8);
    RVar31 = -1;
    iVar29 = iVar25;
  } while (iVar25 == -1);
  goto LAB_001fad49;
LAB_001fac7c:
  piVar7 = (int *)CONCAT44(iStack_514,has_side);
  RVar31 = -1;
  iVar29 = -1;
  if ((long)*piVar7 <= (long)uVar15) goto LAB_001fadc6;
  iVar25 = *(int *)(*(long *)(piVar7 + 2) + uVar15 * 4);
  RVar31 = -1;
  iVar29 = -1;
  if (iVar25 == -1) goto LAB_001fadc6;
  lVar33 = *(long *)(piVar7 + 4);
  do {
    RVar31 = *(REF_INT *)(lVar33 + 4 + (long)iVar25 * 8);
    iVar29 = iVar25;
LAB_001fadc6:
    do {
      if (iVar29 == -1) {
        uVar9 = ref_cell_add(ref_grid->cell[10],(REF_INT *)&ref_cavity_1,&bc);
        if (uVar9 == 0) goto LAB_001fae2c;
        uStackY_720 = (ulong)uVar9;
        pcVar28 = "add pri";
        uVar19 = 0x549;
        goto LAB_001f919f;
      }
      uVar9 = ref_cell_remove(ref_grid->cell[8],RVar31);
      if (uVar9 != 0) {
        uStackY_720 = (ulong)uVar9;
        pcVar28 = "rm tet";
        uVar19 = 0x546;
        goto LAB_001f919f;
      }
      lVar33 = *(long *)(CONCAT44(iStack_514,has_side) + 0x10);
      iVar25 = *(int *)(lVar33 + (long)iVar29 * 8);
      RVar31 = -1;
      iVar29 = iVar25;
    } while (iVar25 == -1);
  } while( true );
LAB_001fae2c:
  pRVar23 = local_6d0;
LAB_001fa8c7:
  uVar15 = uVar15 + 1;
  goto LAB_001fa8a8;
LAB_001fab34:
  pRVar16 = pRVar23->ref_adj->item;
  iVar25 = pRVar16[iVar29].next;
  RVar34 = -1;
  iVar29 = iVar25;
  if (iVar25 != -1) goto LAB_001faa84;
  goto LAB_001faa90;
}

Assistant:

REF_FCN REF_STATUS ref_layer_align_prism(REF_GRID ref_grid,
                                         REF_DICT ref_dict_bcs) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL *active;
  REF_INT *off_node;

  RSS(ref_node_synchronize_globals(ref_node), "sync glob");

  RSS(ref_export_by_extension(ref_grid, "ref_layer_prism_before.tec"),
      "dump surf");

  ref_malloc_init(active, ref_node_max(ref_node), REF_BOOL, REF_FALSE);
  ref_malloc_init(off_node, ref_node_max(ref_node), REF_BOOL, REF_EMPTY);
  /* mark active nodes */
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    REF_INT bc = REF_EMPTY;
    RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
        REF_NOT_FOUND, "bc");
    if (ref_phys_wall_distance_bc(bc)) {
      REF_INT cell_node;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        active[nodes[cell_node]] = REF_TRUE;
      }
    }
  }

  RSS(ref_layer_prism_insert_hair(ref_grid, ref_dict_bcs, active, off_node),
      "insert hair");

  /* recover tet slides of prism tops, extend for boundary */
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
        REF_EMPTY != off_node[nodes[2]]) {
      REF_INT cell_edge;
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        REF_INT node0 = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
        REF_INT node1 = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
        REF_BOOL has_side;
        RSS(ref_cell_has_side(ref_grid_tet(ref_grid), node0, node1, &has_side),
            "find tet side");
        if (!has_side) {
          REF_CAVITY ref_cavity;
          REF_INT tet;
          RSS(ref_layer_seed_tet(ref_grid, node0, node1, &tet), "seed");
          RSS(ref_cavity_create(&ref_cavity), "cav create");
          RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node1), "empty");
          RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
          REIS(REF_CAVITY_UNKNOWN, ref_cavity_state(ref_cavity),
               "add tet not unknown");
          RSB(ref_cavity_enlarge_visible(ref_cavity), "enlarge", {
            ref_cavity_tec(ref_cavity, "cav-fail.tec");
            ref_export_by_extension(ref_grid, "mesh-fail.tec");
          });
          REIB(REF_CAVITY_VISIBLE, ref_cavity_state(ref_cavity),
               "prism top not visible", {
                 ref_cavity_tec(ref_cavity, "ref_layer_prism_cavity.tec");
                 ref_export_by_extension(ref_grid, "ref_layer_prism_mesh.tec");
               });
          RSB(ref_cavity_replace(ref_cavity), "cav replace", {
            ref_cavity_tec(ref_cavity, "ref_layer_prism_cavity.tec");
            ref_export_by_extension(ref_grid, "ref_layer_prism_mesh.tec");
          });
          RSS(ref_cavity_free(ref_cavity), "cav free");
        }
      }
    }
  }
  /* recover prism sides */
  {
    REF_INT cell_edge;
    REF_INT quad[4], face_nodes[4], tet0, tet1;
    REF_BOOL has_side;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
          REF_EMPTY != off_node[nodes[2]]) {
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          quad[0] = REF_EMPTY;
          quad[1] = REF_EMPTY;
          quad[2] = REF_EMPTY;
          quad[3] = REF_EMPTY;
          RSS(ref_cell_has_side(
                  ref_grid_tet(ref_grid),
                  ref_cell_e2n(ref_cell, 0, cell_edge, cell),
                  off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)],
                  &has_side),
              "diag");
          if (has_side) {
            quad[0] = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
            quad[1] = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
            quad[2] = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
            quad[3] = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
          }
          RSS(ref_cell_has_side(
                  ref_grid_tet(ref_grid),
                  ref_cell_e2n(ref_cell, 1, cell_edge, cell),
                  off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)],
                  &has_side),
              "diag");
          if (has_side) {
            quad[0] = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
            quad[1] = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
            quad[2] = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
            quad[3] = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
          }
          RUS(REF_EMPTY, quad[0], "diag not found");
          face_nodes[0] = quad[0];
          face_nodes[1] = quad[1];
          face_nodes[2] = quad[2];
          face_nodes[3] = face_nodes[0];
          RSS(ref_cell_with_face(ref_grid_tet(ref_grid), face_nodes, &tet0,
                                 &tet1),
              "tets");
          if (tet0 == REF_EMPTY && tet1 == REF_EMPTY) {
            RSS(ref_layer_recover_face(ref_grid, face_nodes), "recover upper");
            printf("lower tets %d %d\n", tet0, tet1);
          }
          face_nodes[0] = quad[0];
          face_nodes[1] = quad[2];
          face_nodes[2] = quad[3];
          face_nodes[3] = face_nodes[0];
          RSS(ref_cell_with_face(ref_grid_tet(ref_grid), face_nodes, &tet0,
                                 &tet1),
              "tets");
          if (tet0 == REF_EMPTY && tet1 == REF_EMPTY) {
            RSS(ref_layer_recover_face(ref_grid, face_nodes), "recover upper");
            printf("upper tets %d %d\n", tet0, tet1);
          }
        }
      }
    }
  }
  /* remove quad slivers */
  {
    REF_INT cell_edge;
    REF_INT quad[4];
    REF_BOOL has_diag02, has_diag13;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
          REF_EMPTY != off_node[nodes[2]]) {
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          quad[0] = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
          quad[1] = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
          quad[2] = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
          quad[3] = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
          RSS(ref_cell_has_side(ref_grid_tet(ref_grid), quad[0], quad[2],
                                &has_diag02),
              "diag02");
          RSS(ref_cell_has_side(ref_grid_tet(ref_grid), quad[1], quad[3],
                                &has_diag13),
              "diag13");
          if (has_diag02 && has_diag13) {
            printf("sliver\n");
            RSS(ref_layer_remove_sliver(ref_grid, quad), "remove sliver");
          }
        }
      }
    }
  }
  /* replace tets with prism */
  {
    REF_ADJ tri_tet;
    REF_INT deg;
    RSS(ref_adj_create(&tri_tet), "tet list");
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
          REF_EMPTY != off_node[nodes[2]]) {
        REF_CELL ref_tet = ref_grid_tet(ref_grid);
        REF_INT cell_node, tet, tet_nodes[REF_CELL_MAX_SIZE_PER],
            pri_nodes[REF_CELL_MAX_SIZE_PER];
        REF_BOOL contains;
        pri_nodes[0] = nodes[0];
        pri_nodes[1] = nodes[1];
        pri_nodes[2] = nodes[2];
        pri_nodes[3] = off_node[nodes[0]];
        pri_nodes[4] = off_node[nodes[1]];
        pri_nodes[5] = off_node[nodes[2]];
        each_ref_cell_having_node2(ref_tet, nodes[0], off_node[nodes[0]], item,
                                   cell_node, tet) {
          RSS(ref_cell_nodes(ref_tet, tet, tet_nodes), "tet");
          RSS(ref_layer_tet_prism(pri_nodes, tet_nodes, &contains), "contains");
          if (contains) {
            RSS(ref_adj_add_uniquely(tri_tet, cell, tet), "add");
          }
        }
        each_ref_cell_having_node2(ref_tet, nodes[1], off_node[nodes[1]], item,
                                   cell_node, tet) {
          RSS(ref_cell_nodes(ref_tet, tet, tet_nodes), "tet");
          RSS(ref_layer_tet_prism(pri_nodes, tet_nodes, &contains), "contains");
          if (contains) {
            RSS(ref_adj_add_uniquely(tri_tet, cell, tet), "add");
          }
        }
        each_ref_cell_having_node2(ref_tet, nodes[2], off_node[nodes[2]], item,
                                   cell_node, tet) {
          RSS(ref_cell_nodes(ref_tet, tet, tet_nodes), "tet");
          RSS(ref_layer_tet_prism(pri_nodes, tet_nodes, &contains), "contains");
          if (contains) {
            RSS(ref_adj_add_uniquely(tri_tet, cell, tet), "add");
          }
        }

        RSS(ref_adj_degree(tri_tet, cell, &deg), "deg");
        if (3 != deg) {
          REF_CAVITY ref_cavity;
          char filename[1024];
          RSS(ref_cavity_create(&ref_cavity), "cav create");
          RSS(ref_cavity_form_empty(ref_cavity, ref_grid, REF_EMPTY), "empty");
          each_ref_adj_node_item_with_ref(tri_tet, cell, item, tet) {
            RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
          }
          snprintf(filename, 1024, "prism-%d-cav.tec", cell);
          printf("prism tets %d %s\n", deg, filename);
          RSS(ref_cavity_tec(ref_cavity, filename), "cav tec");
          RSS(ref_cavity_free(ref_cavity), "cav free");
        }
        if (3 == deg) {
          REF_INT new_pri;
          each_ref_adj_node_item_with_ref(tri_tet, cell, item, tet) {
            RSS(ref_cell_remove(ref_grid_tet(ref_grid), tet), "rm tet");
          }
          RSS(ref_cell_add(ref_grid_pri(ref_grid), pri_nodes, &new_pri),
              "add pri");
        }
      }
    }
    RSS(ref_adj_free(tri_tet), "free");
  }
  /* replace two tets with pyramid */
  each_ref_cell_valid_cell_with_nodes(ref_grid_pri(ref_grid), cell, nodes) {
    REF_CAVITY ref_cavity;
    char filename[1024];
    REF_INT cell_face, tet, cell_node;
    each_ref_cell_cell_face(ref_grid_pri(ref_grid), cell_face) {
      RSS(ref_cavity_create(&ref_cavity), "cav create");
      RSS(ref_cavity_form_empty(ref_cavity, ref_grid, REF_EMPTY), "empty");
      if (ref_cell_f2n(ref_grid_pri(ref_grid), 0, cell_face, cell) !=
          ref_cell_f2n(ref_grid_pri(ref_grid), 3, cell_face, cell)) {
        each_ref_cell_having_node2(
            ref_grid_tet(ref_grid),
            ref_cell_f2n(ref_grid_pri(ref_grid), 0, cell_face, cell),
            ref_cell_f2n(ref_grid_pri(ref_grid), 2, cell_face, cell), item,
            cell_node, tet) {
          RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
        }
        each_ref_cell_having_node2(
            ref_grid_tet(ref_grid),
            ref_cell_f2n(ref_grid_pri(ref_grid), 1, cell_face, cell),
            ref_cell_f2n(ref_grid_pri(ref_grid), 3, cell_face, cell), item,
            cell_node, tet) {
          RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
        }
      }
      if (2 != ref_list_n(ref_cavity_tet_list(ref_cavity)) &&
          0 != ref_list_n(ref_cavity_tet_list(ref_cavity))) {
        snprintf(filename, 1024, "glue-%d-%d-cav.tec", cell, cell_face);
        printf("pyramid tets missing %d %s\n",
               ref_list_n(ref_cavity_tet_list(ref_cavity)), filename);
        if (0 < ref_cavity_nface(ref_cavity))
          RSS(ref_cavity_tec(ref_cavity, filename), "cav tec");
      }
      if (2 == ref_list_n(ref_cavity_tet_list(ref_cavity))) {
        /* replace two tets with pyramid */
        RSS(ref_layer_tet_to_pyr(
                ref_grid, cell,
                ref_list_value(ref_cavity_tet_list(ref_cavity), 0),
                ref_list_value(ref_cavity_tet_list(ref_cavity), 1)),
            "tet2pyr");
      }
      RSS(ref_cavity_free(ref_cavity), "cav free");
    }
  }

  RSS(ref_export_by_extension(ref_grid, "ref_layer_prism_after.tec"),
      "dump surf after");
  ref_free(off_node);
  ref_free(active);

  return REF_SUCCESS;
}